

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,KeyComparator cmp,
          Arena *arena)

{
  long lVar1;
  Node *pNVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->compare_).comparator.super_Comparator._vptr_Comparator =
       (_func_int **)&PTR__Comparator_013ba470;
  (this->compare_).comparator.user_comparator_ =
       (Comparator *)cmp.comparator.super_Comparator._vptr_Comparator._vptr_Comparator[1];
  this->arena_ = (Arena *)cmp.comparator.user_comparator_;
  pNVar2 = (Node *)Arena::AllocateAligned((Arena *)cmp.comparator.user_comparator_,0x68);
  pNVar2->key = (char *)0x0;
  pNVar2->next_[0]._M_b._M_p = (__pointer_type)0x0;
  this->head_ = pNVar2;
  this->max_height_ = (__atomic_base<int>)0x1;
  this->rnd_ = 0x5eadbeef;
  lVar3 = 1;
  do {
    this->head_->next_[lVar3 + -1]._M_b._M_p = (__pointer_type)0x0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xd);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SkipList<Key, Comparator>::SkipList(Comparator cmp, Arena* arena)
    : compare_(cmp),
      arena_(arena),
      head_(NewNode(0 /* any key will do */, kMaxHeight)),
      max_height_(1),
      rnd_(0xdeadbeef) {
  for (int i = 0; i < kMaxHeight; i++) {
    head_->SetNext(i, nullptr);
  }
}